

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O1

void archive_entry_set_hardlink(archive_entry *entry,char *target)

{
  wchar_t wVar1;
  
  wVar1 = entry->ae_set;
  if (target == (char *)0x0) {
    entry->ae_set = wVar1 & 0xfffffffe;
    if ((wVar1 & 2U) != 0) {
      return;
    }
  }
  else {
    entry->ae_set = wVar1 | 1;
  }
  *(byte *)&entry->ae_set = (byte)entry->ae_set & 0xfd;
  archive_mstring_copy_mbs(&entry->ae_linkname,target);
  return;
}

Assistant:

void
archive_entry_set_hardlink(struct archive_entry *entry, const char *target)
{
	if (target == NULL) {
		entry->ae_set &= ~AE_SET_HARDLINK;
		if (entry->ae_set & AE_SET_SYMLINK) {
			return;
		}
	} else {
		entry->ae_set |= AE_SET_HARDLINK;
	}
	entry->ae_set &= ~AE_SET_SYMLINK;
	archive_mstring_copy_mbs(&entry->ae_linkname, target);
}